

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_buf.c
# Opt level: O0

size_t ares_buf_consume_charset(ares_buf_t *buf,uchar *charset,size_t len)

{
  uchar *puVar1;
  ulong local_48;
  size_t j;
  size_t i;
  uchar *ptr;
  size_t remaining_len;
  size_t len_local;
  uchar *charset_local;
  ares_buf_t *buf_local;
  
  ptr = (uchar *)0x0;
  remaining_len = len;
  len_local = (size_t)charset;
  charset_local = (uchar *)buf;
  puVar1 = ares_buf_fetch(buf,(size_t *)&ptr);
  if (((puVar1 == (uchar *)0x0) || (len_local == 0)) || (remaining_len == 0)) {
    buf_local = (ares_buf_t *)0x0;
  }
  else {
    for (j = 0; j < ptr; j = j + 1) {
      for (local_48 = 0;
          (local_48 < remaining_len && (puVar1[j] != *(uchar *)(len_local + local_48)));
          local_48 = local_48 + 1) {
      }
      if (local_48 == remaining_len) break;
    }
    if (j != 0) {
      ares_buf_consume((ares_buf_t *)charset_local,j);
    }
    buf_local = (ares_buf_t *)j;
  }
  return (size_t)buf_local;
}

Assistant:

size_t ares_buf_consume_charset(ares_buf_t *buf, const unsigned char *charset,
                                size_t len)
{
  size_t               remaining_len = 0;
  const unsigned char *ptr           = ares_buf_fetch(buf, &remaining_len);
  size_t               i;

  if (ptr == NULL || charset == NULL || len == 0) {
    return 0;
  }

  for (i = 0; i < remaining_len; i++) {
    size_t j;
    for (j = 0; j < len; j++) {
      if (ptr[i] == charset[j]) {
        break;
      }
    }
    /* Not found */
    if (j == len) {
      break;
    }
  }

  if (i > 0) {
    ares_buf_consume(buf, i);
  }
  return i;
}